

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O0

uint64_t __thiscall banksia::ChessBoard::hashKeyEnpassant(ChessBoard *this,int enpassant)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int in_ESI;
  long *in_RDI;
  bool ok;
  int row;
  int col;
  uint64_t key;
  bool local_34;
  bool local_33;
  bool local_32;
  bool local_31;
  Side side;
  PieceType in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  uint64_t local_18;
  
  local_18 = 0;
  if (in_ESI < 1) {
    return 0;
  }
  iVar2 = (**(code **)(*in_RDI + 0x40))(in_RDI,in_ESI);
  iVar3 = (**(code **)(*in_RDI + 0x48))(in_RDI,in_ESI);
  in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc & 0xffffff;
  side = (Side)((ulong)in_RDI >> 0x20);
  if (iVar3 == 2) {
    if (0 < iVar2) {
      bVar1 = BoardCore::isPiece((BoardCore *)CONCAT44(iVar2,2),in_stack_ffffffffffffffdc,
                                 in_stack_ffffffffffffffd8,side);
      local_31 = true;
      local_33 = local_31;
      if (bVar1) goto LAB_001eb653;
    }
    local_32 = false;
    local_33 = local_32;
    if (iVar2 < 7) {
      local_33 = BoardCore::isPiece((BoardCore *)CONCAT44(iVar2,iVar3),in_stack_ffffffffffffffdc,
                                    in_stack_ffffffffffffffd8,side);
    }
  }
  else {
    if (0 < iVar2) {
      bVar1 = BoardCore::isPiece((BoardCore *)CONCAT44(iVar2,iVar3),in_stack_ffffffffffffffdc,
                                 in_stack_ffffffffffffffd8,side);
      local_33 = true;
      if (bVar1) goto LAB_001eb653;
    }
    local_34 = false;
    local_33 = local_34;
    if (iVar2 < 7) {
      local_33 = BoardCore::isPiece((BoardCore *)CONCAT44(iVar2,iVar3),in_stack_ffffffffffffffdc,
                                    in_stack_ffffffffffffffd8,side);
    }
  }
LAB_001eb653:
  if (local_33 != false) {
    local_18 = RandomEnPassant[iVar2];
  }
  return local_18;
}

Assistant:

u64 ChessBoard::hashKeyEnpassant(int enpassant) const
{
    u64 key = 0;
    
    if (enpassant > 0) {
        
        auto col = getColumn(enpassant), row = getRow(enpassant);
        auto ok = false;
        if (row == 2) {
            ok = (col > 0 && isPiece(enpassant + 7, PieceType::pawn, Side::white))
            || (col < 7 && isPiece(enpassant + 9, PieceType::pawn, Side::white));
        } else {
            ok = (col > 0 && isPiece(enpassant - 9, PieceType::pawn, Side::black))
            || (col < 7 && isPiece(enpassant - 7, PieceType::pawn, Side::black));
        }
        if (ok) key ^= RandomEnPassant[col];
    }
    
    return key;
}